

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  bool bVar1;
  LogMessage *this;
  LogMessage *other;
  int in_ESI;
  FieldDescriptor *in_RDI;
  LogMessage *in_stack_ffffffffffffff18;
  LogMessage *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff30;
  LogMessage local_90 [2];
  int local_c;
  FieldDescriptor *local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (in_RDI != (FieldDescriptor *)0x0) {
    local_c = in_ESI;
    local_8 = in_RDI;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x444843);
    if ((bVar1) && (local_c == -1)) {
      internal::LogMessage::LogMessage
                (in_stack_ffffffffffffff30,level,(char *)in_stack_ffffffffffffff20,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      internal::LogMessage::operator<<(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
      internal::LogMessage::operator<<(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
      FieldDescriptor::name_abi_cxx11_(local_8);
      internal::LogMessage::operator<<
                (in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      internal::LogMessage::~LogMessage((LogMessage *)0x4448f8);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x444930);
      if ((!bVar1) && (local_c != -1)) {
        internal::LogMessage::LogMessage
                  (local_90,level,(char *)in_stack_ffffffffffffff20,
                   (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        internal::LogMessage::operator<<
                  (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
        internal::LogMessage::operator<<
                  (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
        this = (LogMessage *)FieldDescriptor::name_abi_cxx11_(local_8);
        other = internal::LogMessage::operator<<(this,(string *)in_stack_ffffffffffffff18);
        internal::LogFinisher::operator=((LogFinisher *)this,other);
        internal::LogMessage::~LogMessage((LogMessage *)0x4449d9);
      }
    }
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == nullptr) {
    return;
  }

  if (field->is_repeated() && index == -1) {
    GOOGLE_LOG(DFATAL) << "Index must be in range of repeated field values. "
                << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    GOOGLE_LOG(DFATAL) << "Index must be -1 for singular fields."
                << "Field: " << field->name();
  }
}